

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_validators.h
# Opt level: O3

bool cppcms::encoding::ascii_valid<char_const*>(char *p,char *e,size_t *count)

{
  byte bVar1;
  size_t sVar2;
  
  if (p != e) {
    sVar2 = *count;
    do {
      sVar2 = sVar2 + 1;
      *count = sVar2;
      bVar1 = *p;
      if (((0xd < bVar1) || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)) && ((byte)(bVar1 + 0x81) < 0xa1)
         ) {
        return false;
      }
      p = (char *)((byte *)p + 1);
    } while (p != e);
  }
  return true;
}

Assistant:

bool ascii_valid(Iterator p,Iterator e,size_t &count)
	{
		while(p!=e) {
			count++;
			unsigned c=(unsigned char)*p++;
			if(c==0x09 || c==0xA || c==0xD)
				continue;
			if(c<0x20 || 0x7E < c)
				return false;
		}
		return true;
	}